

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O2

string * __thiscall
absl::FormatDuration_abi_cxx11_(string *__return_storage_ptr__,absl *this,Duration d)

{
  double dVar1;
  DisplayUnit unit;
  DisplayUnit unit_00;
  bool bVar2;
  int64_t iVar3;
  undefined1 *puVar4;
  uint uVar5;
  undefined8 extraout_RDX;
  undefined4 uVar6;
  undefined4 uVar7;
  Duration DVar8;
  Duration num;
  Duration num_00;
  Duration num_01;
  Duration num_02;
  allocator<char> local_31;
  Duration local_30;
  
  uVar5 = (uint)d.rep_hi_;
  local_30.rep_hi_ = (int64_t)this;
  local_30.rep_lo_ = uVar5;
  if (uVar5 == 0 && this == (absl *)0x8000000000000000) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"-2562047788015215h30m8s",&local_31);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((long)this < 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"-");
      DVar8.rep_hi_ = (ulong)uVar5;
      DVar8._8_8_ = extraout_RDX;
      DVar8 = operator-(this,DVar8);
      local_30.rep_hi_ = DVar8.rep_hi_;
      uVar5 = DVar8.rep_lo_;
    }
    local_30.rep_lo_ = uVar5;
    if (uVar5 == 0xffffffff && (absl *)local_30.rep_hi_ == (absl *)0x7fffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,"inf");
    }
    else {
      if (local_30.rep_hi_ < 1) {
        if (uVar5 < 4000 || (absl *)local_30.rep_hi_ != (absl *)0x0) {
          num_02.rep_lo_ = uVar5;
          num_02.rep_hi_ = local_30.rep_hi_;
          num_02._12_4_ = 0;
          dVar1 = FDivDuration(num_02,(Duration)(ZEXT816(4) << 0x40));
          uVar6 = SUB84(dVar1,0);
          uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
          puVar4 = (anonymous_namespace)::kDisplayNano;
        }
        else if (uVar5 < 4000000) {
          dVar1 = FDivDuration((Duration)(ZEXT416(uVar5) << 0x40),(Duration)(ZEXT816(4000) << 0x40))
          ;
          uVar6 = SUB84(dVar1,0);
          uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
          puVar4 = (anonymous_namespace)::kDisplayMicro;
        }
        else {
          dVar1 = FDivDuration((Duration)(ZEXT416(uVar5) << 0x40),
                               (Duration)(ZEXT816(4000000) << 0x40));
          uVar6 = SUB84(dVar1,0);
          uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
          puVar4 = (anonymous_namespace)::kDisplayMilli;
        }
      }
      else {
        num.rep_lo_ = uVar5;
        num.rep_hi_ = local_30.rep_hi_;
        num._12_4_ = 0;
        iVar3 = IDivDuration(num,(Duration)ZEXT816(0xe10),&local_30);
        unit.abbr._M_str = (char *)0x159100;
        unit.abbr._M_len = 1;
        unit._16_8_ = 0xffffffff;
        unit.pow10 = 0.0;
        anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,iVar3,unit);
        num_00.rep_lo_ = local_30.rep_lo_;
        num_00.rep_hi_ = local_30.rep_hi_;
        num_00._12_4_ = 0;
        iVar3 = IDivDuration(num_00,(Duration)ZEXT816(0x3c),&local_30);
        unit_00.abbr._M_str = (char *)0x15aed7;
        unit_00.abbr._M_len = 1;
        unit_00._16_8_ = 0xffffffff;
        unit_00.pow10 = 0.0;
        anon_unknown_0::AppendNumberUnit(__return_storage_ptr__,iVar3,unit_00);
        num_01.rep_lo_ = local_30.rep_lo_;
        num_01.rep_hi_ = local_30.rep_hi_;
        num_01._12_4_ = 0;
        dVar1 = FDivDuration(num_01,(Duration)ZEXT816(1));
        uVar6 = SUB84(dVar1,0);
        uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
        puVar4 = (anonymous_namespace)::kDisplaySec;
      }
      anon_unknown_0::AppendNumberUnit
                (__return_storage_ptr__,(double)CONCAT44(uVar7,uVar6),*(DisplayUnit *)puVar4);
    }
    if ((__return_storage_ptr__->_M_string_length != 0) &&
       (bVar2 = std::operator==(__return_storage_ptr__,"-"), !bVar2)) {
      return __return_storage_ptr__;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (__return_storage_ptr__,"0");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatDuration(Duration d) {
  const Duration min_duration = Seconds(kint64min);
  if (d == min_duration) {
    // Avoid needing to negate kint64min by directly returning what the
    // following code should produce in that case.
    return "-2562047788015215h30m8s";
  }
  std::string s;
  if (d < ZeroDuration()) {
    s.append("-");
    d = -d;
  }
  if (d == InfiniteDuration()) {
    s.append("inf");
  } else if (d < Seconds(1)) {
    // Special case for durations with a magnitude < 1 second.  The duration
    // is printed as a fraction of a single unit, e.g., "1.2ms".
    if (d < Microseconds(1)) {
      AppendNumberUnit(&s, FDivDuration(d, Nanoseconds(1)), kDisplayNano);
    } else if (d < Milliseconds(1)) {
      AppendNumberUnit(&s, FDivDuration(d, Microseconds(1)), kDisplayMicro);
    } else {
      AppendNumberUnit(&s, FDivDuration(d, Milliseconds(1)), kDisplayMilli);
    }
  } else {
    AppendNumberUnit(&s, IDivDuration(d, Hours(1), &d), kDisplayHour);
    AppendNumberUnit(&s, IDivDuration(d, Minutes(1), &d), kDisplayMin);
    AppendNumberUnit(&s, FDivDuration(d, Seconds(1)), kDisplaySec);
  }
  if (s.empty() || s == "-") {
    s = "0";
  }
  return s;
}